

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall FxPostIncrDecr::FxPostIncrDecr(FxPostIncrDecr *this,FxExpression *base,int token)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&base->ScriptPosition)
  ;
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_PostIncrDecr;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxPostIncrDecr_0070baf8;
  this->Token = token;
  this->Base = base;
  return;
}

Assistant:

FxPostIncrDecr::FxPostIncrDecr(FxExpression *base, int token)
: FxExpression(EFX_PostIncrDecr, base->ScriptPosition), Token(token), Base(base)
{
}